

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBufferTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureBufferBindingQueryCase::iterate
          (TextureBufferBindingQueryCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestLog *pTVar3;
  bool bVar4;
  ContextType ctxType;
  int iVar5;
  GLenum GVar6;
  undefined4 extraout_var;
  long *plVar7;
  NotSupportedError *this_00;
  size_type *psVar8;
  ulong uVar9;
  undefined8 uVar10;
  GLuint buffer;
  ScopedLogSection section;
  CallLogWrapper gl;
  ScopedLogSection section_1;
  ResultCollector result;
  string local_150;
  GLuint local_12c;
  string local_128;
  ScopedLogSection local_108;
  long local_100;
  TestLog local_f8;
  long lStack_f0;
  CallLogWrapper local_e8;
  ScopedLogSection local_d0;
  string local_c8;
  ulong *local_a8;
  long local_a0;
  ulong local_98 [2];
  ResultCollector local_88;
  code *local_38;
  GLenum local_30;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar4 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar4) {
    bVar4 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,"GL_EXT_texture_buffer");
    if (!bVar4) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"GL_EXT_texture_buffer is not supported",
                 "supportsES32 || m_context.getContextInfo().isExtensionSupported(\"GL_EXT_texture_buffer\")"
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureBufferTests.cpp"
                 ,0xdf);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_e8,(Functions *)CONCAT44(extraout_var,iVar5),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  paVar1 = &local_150.field_2;
  local_150._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_88,pTVar3,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar1) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  local_e8.m_enableLog = true;
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_150._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"initial","");
  paVar2 = &local_128.field_2;
  local_128._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"Initial value","");
  tcu::ScopedLogSection::ScopedLogSection(&local_108,pTVar3,&local_150,&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar1) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  deqp::gls::StateQueryUtil::verifyStateInteger(&local_88,&local_e8,0x8c2a,0,this->m_type);
  tcu::TestLog::endSection(local_108.m_log);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_150._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"bind","");
  local_128._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"After bind","");
  tcu::ScopedLogSection::ScopedLogSection(&local_d0,pTVar3,&local_150,&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar1) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glGenBuffers(&local_e8,1,&local_12c);
  glu::CallLogWrapper::glBindBuffer(&local_e8,0x8c2a,local_12c);
  GVar6 = glu::CallLogWrapper::glGetError(&local_e8);
  if (GVar6 == 0) goto LAB_01637cde;
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Got Error ","");
  local_38 = glu::getErrorName;
  local_30 = GVar6;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_c8,&local_38);
  uVar9 = 0xf;
  if (local_a8 != local_98) {
    uVar9 = local_98[0];
  }
  if (uVar9 < local_c8._M_string_length + local_a0) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      uVar10 = local_c8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_c8._M_string_length + local_a0) goto LAB_01637b39;
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_a8);
  }
  else {
LAB_01637b39:
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_a8,(ulong)local_c8._M_dataplus._M_p);
  }
  local_108.m_log = &local_f8;
  pTVar3 = (TestLog *)(plVar7 + 2);
  if ((TestLog *)*plVar7 == pTVar3) {
    local_f8.m_log = pTVar3->m_log;
    lStack_f0 = plVar7[3];
  }
  else {
    local_f8.m_log = pTVar3->m_log;
    local_108.m_log = (TestLog *)*plVar7;
  }
  local_100 = plVar7[1];
  *plVar7 = (long)pTVar3;
  plVar7[1] = 0;
  *(undefined1 *)&pTVar3->m_log = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_108);
  psVar8 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_128.field_2._M_allocated_capacity = *psVar8;
    local_128.field_2._8_8_ = plVar7[3];
    local_128._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_128.field_2._M_allocated_capacity = *psVar8;
    local_128._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_128._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_128);
  psVar8 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_150.field_2._M_allocated_capacity = *psVar8;
    local_150.field_2._8_8_ = plVar7[3];
    local_150._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_150.field_2._M_allocated_capacity = *psVar8;
    local_150._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_150._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  tcu::ResultCollector::fail(&local_88,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar1) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if (local_108.m_log != &local_f8) {
    operator_delete(local_108.m_log,(ulong)((long)&(local_f8.m_log)->flags + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
LAB_01637cde:
  deqp::gls::StateQueryUtil::verifyStateInteger(&local_88,&local_e8,0x8c2a,local_12c,this->m_type);
  glu::CallLogWrapper::glDeleteBuffers(&local_e8,1,&local_12c);
  tcu::TestLog::endSection(local_d0.m_log);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_150._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"bind","");
  local_128._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"After delete","");
  tcu::ScopedLogSection::ScopedLogSection(&local_108,pTVar3,&local_150,&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar1) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  deqp::gls::StateQueryUtil::verifyStateInteger(&local_88,&local_e8,0x8c2a,0,this->m_type);
  tcu::TestLog::endSection(local_108.m_log);
  tcu::ResultCollector::setTestContextResult
            (&local_88,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.m_message._M_dataplus._M_p != &local_88.m_message.field_2) {
    operator_delete(local_88.m_message._M_dataplus._M_p,
                    local_88.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.m_prefix._M_dataplus._M_p != &local_88.m_prefix.field_2) {
    operator_delete(local_88.m_prefix._M_dataplus._M_p,
                    local_88.m_prefix.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::~CallLogWrapper(&local_e8);
  return STOP;
}

Assistant:

TextureBufferBindingQueryCase::IterateResult TextureBufferBindingQueryCase::iterate (void)
{
	const bool supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));
	TCU_CHECK_AND_THROW(NotSupportedError, supportsES32 || m_context.getContextInfo().isExtensionSupported("GL_EXT_texture_buffer"), "GL_EXT_texture_buffer is not supported");

	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	// initial
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "initial", "Initial value");

		verifyStateInteger(result, gl, GL_TEXTURE_BUFFER_BINDING, 0, m_type);
	}

	// bind
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "bind", "After bind");

		glw::GLuint buffer;

		gl.glGenBuffers(1, &buffer);
		gl.glBindBuffer(GL_TEXTURE_BUFFER, buffer);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "bind buffer");

		verifyStateInteger(result, gl, GL_TEXTURE_BUFFER_BINDING, buffer, m_type);

		gl.glDeleteBuffers(1, &buffer);
	}

	// after delete
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "bind", "After delete");

		verifyStateInteger(result, gl, GL_TEXTURE_BUFFER_BINDING, 0, m_type);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}